

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_hash(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined8 uVar11;
  long lVar12;
  undefined8 uVar13;
  int *piVar14;
  undefined8 uVar15;
  code *pcVar16;
  int n_name2_1;
  int n_userdata;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  int n_f_2;
  undefined8 *puVar27;
  int n_userdata_4;
  int n_name3_1;
  uint uVar28;
  int iVar29;
  bool bVar30;
  int test_ret_3;
  int test_ret_1;
  int test_ret_2;
  int test_ret;
  int test_ret_4;
  int test_ret_8;
  int test_ret_9;
  int test_ret_7;
  ulong local_68;
  int local_5c;
  ulong local_58;
  ulong local_50;
  int local_3c;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing hash : 17 of 25 functions ...");
  }
  iVar1 = 0;
  uVar25 = 0;
  do {
    uVar24 = 0;
    do {
      iVar17 = 0;
      do {
        iVar2 = xmlMemBlocks();
        if (uVar25 == 0) {
          lVar12 = xmlHashCreate(10);
        }
        else {
          lVar12 = 0;
        }
        if (uVar24 < 4) {
          uVar21 = (&DAT_00162d68)[uVar24];
        }
        else {
          uVar21 = 0;
        }
        piVar14 = &call_tests;
        if (iVar17 != 0) {
          if (iVar17 == 1) {
            piVar14 = (int *)0xffffffffffffffff;
          }
          else {
            piVar14 = (int *)0x0;
          }
        }
        xmlHashAddEntry(lVar12,uVar21,piVar14);
        call_tests = call_tests + 1;
        if (lVar12 != 0) {
          xmlHashFree(lVar12);
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashAddEntry",(ulong)(uint)(iVar3 - iVar2));
          iVar1 = iVar1 + 1;
          printf(" %d",(ulong)uVar25);
          printf(" %d",(ulong)uVar24);
          printf(" %d");
          putchar(10);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != 3);
      uVar24 = uVar24 + 1;
    } while (uVar24 != 5);
    bVar30 = uVar25 == 0;
    uVar25 = uVar25 + 1;
  } while (bVar30);
  function_tests = function_tests + 1;
  local_5c = 0;
  uVar26 = 0;
  do {
    uVar25 = 0;
    do {
      uVar19 = 0;
      do {
        iVar17 = 0;
        do {
          iVar2 = xmlMemBlocks();
          iVar3 = (int)uVar26;
          if (iVar3 == 0) {
            lVar12 = xmlHashCreate(10);
          }
          else {
            lVar12 = 0;
          }
          if (uVar25 < 4) {
            uVar21 = (&DAT_00162d68)[uVar25];
          }
          else {
            uVar21 = 0;
          }
          if ((uint)uVar19 < 4) {
            uVar15 = (&DAT_00162d68)[uVar19];
          }
          else {
            uVar15 = 0;
          }
          piVar14 = &call_tests;
          if (iVar17 != 0) {
            if (iVar17 == 1) {
              piVar14 = (int *)0xffffffffffffffff;
            }
            else {
              piVar14 = (int *)0x0;
            }
          }
          xmlHashAddEntry2(lVar12,uVar21,uVar15,piVar14);
          call_tests = call_tests + 1;
          if (lVar12 != 0) {
            xmlHashFree(lVar12);
          }
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar2 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashAddEntry2",(ulong)(uint)(iVar4 - iVar2));
            local_5c = local_5c + 1;
            printf(" %d",uVar26);
            printf(" %d",(ulong)uVar25);
            printf(" %d",uVar19);
            printf(" %d");
            putchar(10);
          }
          iVar17 = iVar17 + 1;
        } while (iVar17 != 3);
        uVar24 = (uint)uVar19 + 1;
        uVar19 = (ulong)uVar24;
      } while (uVar24 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    uVar26 = (ulong)(iVar3 + 1);
  } while (iVar3 == 0);
  function_tests = function_tests + 1;
  iVar17 = 0;
  local_68 = 0;
  do {
    uVar25 = 0;
    do {
      uVar26 = 0;
      do {
        uVar19 = 0;
        do {
          iVar2 = 0;
          do {
            iVar3 = xmlMemBlocks();
            if ((int)local_68 == 0) {
              lVar12 = xmlHashCreate(10);
            }
            else {
              lVar12 = 0;
            }
            if (uVar25 < 4) {
              uVar21 = (&DAT_00162d68)[uVar25];
            }
            else {
              uVar21 = 0;
            }
            if ((uint)uVar26 < 4) {
              uVar15 = (&DAT_00162d68)[uVar26];
            }
            else {
              uVar15 = 0;
            }
            if ((uint)uVar19 < 4) {
              uVar13 = (&DAT_00162d68)[uVar19];
            }
            else {
              uVar13 = 0;
            }
            piVar14 = &call_tests;
            if (iVar2 != 0) {
              if (iVar2 == 1) {
                piVar14 = (int *)0xffffffffffffffff;
              }
              else {
                piVar14 = (int *)0x0;
              }
            }
            xmlHashAddEntry3(lVar12,uVar21,uVar15,uVar13,piVar14);
            call_tests = call_tests + 1;
            if (lVar12 != 0) {
              xmlHashFree(lVar12);
            }
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            if (iVar3 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashAddEntry3",(ulong)(uint)(iVar4 - iVar3));
              iVar17 = iVar17 + 1;
              printf(" %d",local_68);
              printf(" %d",(ulong)uVar25);
              printf(" %d",uVar26);
              printf(" %d",uVar19);
              printf(" %d");
              putchar(10);
            }
            iVar2 = iVar2 + 1;
          } while (iVar2 != 3);
          uVar24 = (uint)uVar19 + 1;
          uVar19 = (ulong)uVar24;
        } while (uVar24 != 5);
        uVar24 = (uint)uVar26 + 1;
        uVar26 = (ulong)uVar24;
      } while (uVar24 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    bVar30 = (int)local_68 == 0;
    local_68 = (ulong)((int)local_68 + 1);
  } while (bVar30);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar26 = 0;
  do {
    puVar27 = &DAT_00162d68;
    uVar25 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar25 < 4) {
        uVar21 = *puVar27;
      }
      else {
        uVar21 = 0;
      }
      xmlHashDefaultDeallocator(0,uVar21);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      iVar5 = (int)uVar26;
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHashDefaultDeallocator",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",uVar26);
        printf(" %d");
        putchar(10);
      }
      uVar25 = uVar25 + 1;
      puVar27 = puVar27 + 1;
    } while (uVar25 != 5);
    uVar26 = (ulong)(iVar5 + 1);
  } while (iVar5 == 0);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar25 = 0;
  do {
    puVar27 = &DAT_00162d68;
    uVar24 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar25 == 0) {
        lVar12 = xmlHashCreate(10);
      }
      else {
        lVar12 = 0;
      }
      if (uVar24 < 4) {
        uVar21 = *puVar27;
      }
      else {
        uVar21 = 0;
      }
      xmlHashLookup(lVar12,uVar21);
      call_tests = call_tests + 1;
      if (lVar12 != 0) {
        xmlHashFree(lVar12);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHashLookup",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
      }
      uVar24 = uVar24 + 1;
      puVar27 = puVar27 + 1;
    } while (uVar24 != 5);
    bVar30 = uVar25 == 0;
    uVar25 = uVar25 + 1;
  } while (bVar30);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar25 = 0;
  do {
    uVar24 = 0;
    do {
      uVar18 = 0;
      puVar27 = &DAT_00162d68;
      do {
        iVar5 = xmlMemBlocks();
        if (uVar25 == 0) {
          lVar12 = xmlHashCreate(10);
        }
        else {
          lVar12 = 0;
        }
        if (uVar24 < 4) {
          uVar21 = (&DAT_00162d68)[uVar24];
        }
        else {
          uVar21 = 0;
        }
        if (uVar18 < 4) {
          uVar15 = *puVar27;
        }
        else {
          uVar15 = 0;
        }
        xmlHashLookup2(lVar12,uVar21,uVar15);
        call_tests = call_tests + 1;
        if (lVar12 != 0) {
          xmlHashFree(lVar12);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashLookup2",(ulong)(uint)(iVar6 - iVar5));
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar25);
          printf(" %d",(ulong)uVar24);
          printf(" %d");
          putchar(10);
        }
        uVar18 = uVar18 + 1;
        puVar27 = puVar27 + 1;
      } while (uVar18 != 5);
      uVar24 = uVar24 + 1;
    } while (uVar24 != 5);
    bVar30 = uVar25 == 0;
    uVar25 = uVar25 + 1;
  } while (bVar30);
  function_tests = function_tests + 1;
  iVar5 = 0;
  local_68 = 0;
  do {
    uVar25 = 0;
    do {
      uVar26 = 0;
      do {
        puVar27 = &DAT_00162d68;
        uVar24 = 0;
        do {
          iVar6 = xmlMemBlocks();
          if ((int)local_68 == 0) {
            lVar12 = xmlHashCreate(10);
          }
          else {
            lVar12 = 0;
          }
          if (uVar25 < 4) {
            uVar21 = (&DAT_00162d68)[uVar25];
          }
          else {
            uVar21 = 0;
          }
          if ((uint)uVar26 < 4) {
            uVar15 = (&DAT_00162d68)[uVar26];
          }
          else {
            uVar15 = 0;
          }
          if (uVar24 < 4) {
            uVar13 = *puVar27;
          }
          else {
            uVar13 = 0;
          }
          xmlHashLookup3(lVar12,uVar21,uVar15,uVar13);
          call_tests = call_tests + 1;
          if (lVar12 != 0) {
            xmlHashFree(lVar12);
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashLookup3",(ulong)(uint)(iVar7 - iVar6));
            iVar5 = iVar5 + 1;
            printf(" %d",local_68);
            printf(" %d",(ulong)uVar25);
            printf(" %d",uVar26);
            printf(" %d");
            putchar(10);
          }
          uVar24 = uVar24 + 1;
          puVar27 = puVar27 + 1;
        } while (uVar24 != 5);
        uVar24 = (uint)uVar26 + 1;
        uVar26 = (ulong)uVar24;
      } while (uVar24 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    bVar30 = (int)local_68 == 0;
    local_68 = (ulong)((int)local_68 + 1);
  } while (bVar30);
  function_tests = function_tests + 1;
  local_34 = 0;
  uVar26 = 0;
  do {
    uVar25 = 0;
    do {
      uVar24 = 0;
      puVar27 = &DAT_00162d68;
      do {
        iVar6 = xmlMemBlocks();
        iVar7 = (int)uVar26;
        if (iVar7 == 0) {
          lVar12 = xmlHashCreate(10);
        }
        else {
          lVar12 = 0;
        }
        if (uVar25 < 4) {
          uVar21 = (&DAT_00162d68)[uVar25];
        }
        else {
          uVar21 = 0;
        }
        if (uVar24 < 4) {
          uVar15 = *puVar27;
        }
        else {
          uVar15 = 0;
        }
        xmlHashQLookup(lVar12,uVar21,uVar15);
        call_tests = call_tests + 1;
        if (lVar12 != 0) {
          xmlHashFree(lVar12);
        }
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar6 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashQLookup",(ulong)(uint)(iVar8 - iVar6));
          local_34 = local_34 + 1;
          printf(" %d",uVar26);
          printf(" %d",(ulong)uVar25);
          printf(" %d");
          putchar(10);
        }
        uVar24 = uVar24 + 1;
        puVar27 = puVar27 + 1;
      } while (uVar24 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    uVar26 = (ulong)(iVar7 + 1);
  } while (iVar7 == 0);
  function_tests = function_tests + 1;
  local_3c = 0;
  local_58 = 0;
  do {
    uVar25 = 0;
    do {
      uVar26 = 0;
      do {
        uVar19 = 0;
        do {
          uVar24 = 0;
          puVar27 = &DAT_00162d68;
          do {
            iVar6 = xmlMemBlocks();
            if ((int)local_58 == 0) {
              lVar12 = xmlHashCreate(10);
            }
            else {
              lVar12 = 0;
            }
            if (uVar25 < 4) {
              uVar21 = (&DAT_00162d68)[uVar25];
            }
            else {
              uVar21 = 0;
            }
            if ((uint)uVar26 < 4) {
              uVar15 = (&DAT_00162d68)[uVar26];
            }
            else {
              uVar15 = 0;
            }
            if ((uint)uVar19 < 4) {
              uVar13 = (&DAT_00162d68)[uVar19];
            }
            else {
              uVar13 = 0;
            }
            if (uVar24 < 4) {
              uVar22 = *puVar27;
            }
            else {
              uVar22 = 0;
            }
            xmlHashQLookup2(lVar12,uVar21,uVar15,uVar13,uVar22);
            call_tests = call_tests + 1;
            if (lVar12 != 0) {
              xmlHashFree(lVar12);
            }
            xmlResetLastError();
            iVar7 = xmlMemBlocks();
            if (iVar6 != iVar7) {
              iVar7 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashQLookup2",(ulong)(uint)(iVar7 - iVar6));
              local_3c = local_3c + 1;
              printf(" %d",local_58);
              printf(" %d",(ulong)uVar25);
              printf(" %d",uVar26);
              printf(" %d",uVar19);
              printf(" %d");
              putchar(10);
            }
            uVar24 = uVar24 + 1;
            puVar27 = puVar27 + 1;
          } while (uVar24 != 5);
          uVar24 = (uint)uVar19 + 1;
          uVar19 = (ulong)uVar24;
        } while (uVar24 != 5);
        uVar24 = (uint)uVar26 + 1;
        uVar26 = (ulong)uVar24;
      } while (uVar24 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    bVar30 = (int)local_58 == 0;
    local_58 = (ulong)((int)local_58 + 1);
  } while (bVar30);
  function_tests = function_tests + 1;
  local_38 = 0;
  local_50 = 0;
  do {
    uVar25 = 0;
    do {
      uVar24 = 0;
      do {
        uVar18 = 0;
        do {
          uVar26 = 0;
          do {
            uVar19 = 0;
            do {
              uVar28 = 0;
              puVar27 = &DAT_00162d68;
              do {
                iVar6 = xmlMemBlocks();
                if ((int)local_50 == 0) {
                  lVar12 = xmlHashCreate(10);
                }
                else {
                  lVar12 = 0;
                }
                if (uVar25 < 4) {
                  uVar21 = (&DAT_00162d68)[uVar25];
                }
                else {
                  uVar21 = 0;
                }
                if (uVar24 < 4) {
                  uVar15 = (&DAT_00162d68)[uVar24];
                }
                else {
                  uVar15 = 0;
                }
                if (uVar18 < 4) {
                  uVar13 = (&DAT_00162d68)[uVar18];
                }
                else {
                  uVar13 = 0;
                }
                if ((uint)uVar26 < 4) {
                  uVar22 = (&DAT_00162d68)[uVar26];
                }
                else {
                  uVar22 = 0;
                }
                if ((uint)uVar19 < 4) {
                  uVar23 = (&DAT_00162d68)[uVar19];
                }
                else {
                  uVar23 = 0;
                }
                if (uVar28 < 4) {
                  uVar11 = *puVar27;
                }
                else {
                  uVar11 = 0;
                }
                xmlHashQLookup3(lVar12,uVar21,uVar15,uVar13,uVar22,uVar23,uVar11);
                call_tests = call_tests + 1;
                if (lVar12 != 0) {
                  xmlHashFree(lVar12);
                }
                xmlResetLastError();
                iVar7 = xmlMemBlocks();
                if (iVar6 != iVar7) {
                  iVar7 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlHashQLookup3",(ulong)(uint)(iVar7 - iVar6));
                  local_38 = local_38 + 1;
                  printf(" %d",local_50);
                  printf(" %d",(ulong)uVar25);
                  printf(" %d",(ulong)uVar24);
                  printf(" %d",(ulong)uVar18);
                  printf(" %d",uVar26);
                  printf(" %d",uVar19);
                  printf(" %d");
                  putchar(10);
                }
                uVar28 = uVar28 + 1;
                puVar27 = puVar27 + 1;
              } while (uVar28 != 5);
              uVar28 = (uint)uVar19 + 1;
              uVar19 = (ulong)uVar28;
            } while (uVar28 != 5);
            uVar28 = (uint)uVar26 + 1;
            uVar26 = (ulong)uVar28;
          } while (uVar28 != 5);
          uVar18 = uVar18 + 1;
        } while (uVar18 != 5);
        uVar24 = uVar24 + 1;
      } while (uVar24 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    bVar30 = (int)local_50 == 0;
    local_50 = (ulong)((int)local_50 + 1);
  } while (bVar30);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar25 = 0;
  do {
    uVar26 = 0;
    do {
      iVar7 = 0;
      do {
        iVar8 = xmlMemBlocks();
        if (uVar25 == 0) {
          lVar12 = xmlHashCreate(10);
        }
        else {
          lVar12 = 0;
        }
        if ((uint)uVar26 < 4) {
          uVar21 = (&DAT_00162d68)[uVar26];
        }
        else {
          uVar21 = 0;
        }
        pcVar16 = (code *)0x0;
        if (iVar7 == 0) {
          pcVar16 = test_xmlHashDeallocator;
        }
        xmlHashRemoveEntry(lVar12,uVar21,pcVar16);
        call_tests = call_tests + 1;
        if (lVar12 != 0) {
          xmlHashFree(lVar12);
        }
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashRemoveEntry",(ulong)(uint)(iVar9 - iVar8));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar25);
          printf(" %d",uVar26);
          printf(" %d");
          putchar(10);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 == 1);
      uVar24 = (uint)uVar26 + 1;
      uVar26 = (ulong)uVar24;
    } while (uVar24 != 5);
    bVar30 = uVar25 == 0;
    uVar25 = uVar25 + 1;
  } while (bVar30);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar26 = 0;
  do {
    uVar19 = 0;
    do {
      uVar20 = 0;
      do {
        iVar8 = 0;
        do {
          iVar9 = xmlMemBlocks();
          iVar29 = (int)uVar26;
          if (iVar29 == 0) {
            lVar12 = xmlHashCreate(10);
          }
          else {
            lVar12 = 0;
          }
          if ((uint)uVar19 < 4) {
            uVar21 = (&DAT_00162d68)[uVar19];
          }
          else {
            uVar21 = 0;
          }
          if ((uint)uVar20 < 4) {
            uVar15 = (&DAT_00162d68)[uVar20];
          }
          else {
            uVar15 = 0;
          }
          pcVar16 = (code *)0x0;
          if (iVar8 == 0) {
            pcVar16 = test_xmlHashDeallocator;
          }
          xmlHashRemoveEntry2(lVar12,uVar21,uVar15,pcVar16);
          call_tests = call_tests + 1;
          if (lVar12 != 0) {
            xmlHashFree(lVar12);
          }
          xmlResetLastError();
          iVar10 = xmlMemBlocks();
          if (iVar9 != iVar10) {
            iVar10 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashRemoveEntry2",(ulong)(uint)(iVar10 - iVar9));
            iVar7 = iVar7 + 1;
            printf(" %d",uVar26);
            printf(" %d",uVar19);
            printf(" %d",uVar20);
            printf(" %d");
            putchar(10);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 == 1);
        uVar25 = (uint)uVar20 + 1;
        uVar20 = (ulong)uVar25;
      } while (uVar25 != 5);
      uVar25 = (uint)uVar19 + 1;
      uVar19 = (ulong)uVar25;
    } while (uVar25 != 5);
    uVar26 = (ulong)(iVar29 + 1);
  } while (iVar29 == 0);
  iVar1 = local_5c + iVar1 + iVar17 + iVar2 + iVar3 + iVar4 + iVar5 + local_34 + local_3c + local_38
  ;
  function_tests = function_tests + 1;
  iVar17 = 0;
  local_68 = 0;
  do {
    uVar26 = 0;
    do {
      uVar19 = 0;
      do {
        uVar20 = 0;
        do {
          iVar2 = 0;
          do {
            iVar3 = xmlMemBlocks();
            if ((int)local_68 == 0) {
              lVar12 = xmlHashCreate(10);
            }
            else {
              lVar12 = 0;
            }
            if ((uint)uVar26 < 4) {
              uVar21 = (&DAT_00162d68)[uVar26];
            }
            else {
              uVar21 = 0;
            }
            if ((uint)uVar19 < 4) {
              uVar15 = (&DAT_00162d68)[uVar19];
            }
            else {
              uVar15 = 0;
            }
            if ((uint)uVar20 < 4) {
              uVar13 = (&DAT_00162d68)[uVar20];
            }
            else {
              uVar13 = 0;
            }
            pcVar16 = (code *)0x0;
            if (iVar2 == 0) {
              pcVar16 = test_xmlHashDeallocator;
            }
            xmlHashRemoveEntry3(lVar12,uVar21,uVar15,uVar13,pcVar16);
            call_tests = call_tests + 1;
            if (lVar12 != 0) {
              xmlHashFree(lVar12);
            }
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            if (iVar3 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashRemoveEntry3",(ulong)(uint)(iVar4 - iVar3));
              iVar17 = iVar17 + 1;
              printf(" %d",local_68);
              printf(" %d",uVar26);
              printf(" %d",uVar19);
              printf(" %d",uVar20);
              printf(" %d");
              putchar(10);
            }
            iVar2 = iVar2 + 1;
          } while (iVar2 == 1);
          uVar25 = (uint)uVar20 + 1;
          uVar20 = (ulong)uVar25;
        } while (uVar25 != 5);
        uVar25 = (uint)uVar19 + 1;
        uVar19 = (ulong)uVar25;
      } while (uVar25 != 5);
      uVar25 = (uint)uVar26 + 1;
      uVar26 = (ulong)uVar25;
    } while (uVar25 != 5);
    bVar30 = (int)local_68 == 0;
    local_68 = (ulong)((int)local_68 + 1);
  } while (bVar30);
  function_tests = function_tests + 1;
  iVar2 = 0;
  local_3c = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (iVar2 == 0) {
      lVar12 = xmlHashCreate(10);
    }
    else {
      lVar12 = 0;
    }
    xmlHashSize(lVar12);
    call_tests = call_tests + 1;
    if (lVar12 != 0) {
      xmlHashFree(lVar12,0);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlHashSize",(ulong)(uint)(iVar4 - iVar3));
      local_3c = local_3c + 1;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 == 1);
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar26 = 0;
  do {
    uVar19 = 0;
    do {
      uVar25 = 0;
      do {
        iVar2 = 0;
        do {
          iVar3 = xmlMemBlocks();
          iVar4 = (int)uVar26;
          if (iVar4 == 0) {
            lVar12 = xmlHashCreate(10);
          }
          else {
            lVar12 = 0;
          }
          if ((uint)uVar19 < 4) {
            uVar21 = (&DAT_00162d68)[uVar19];
          }
          else {
            uVar21 = 0;
          }
          piVar14 = &call_tests;
          if (uVar25 != 0) {
            if (uVar25 == 1) {
              piVar14 = (int *)0xffffffffffffffff;
            }
            else {
              piVar14 = (int *)0x0;
            }
          }
          pcVar16 = (code *)0x0;
          if (iVar2 == 0) {
            pcVar16 = test_xmlHashDeallocator;
          }
          xmlHashUpdateEntry(lVar12,uVar21,piVar14,pcVar16);
          call_tests = call_tests + 1;
          if (lVar12 != 0) {
            xmlHashFree(lVar12);
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar3 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashUpdateEntry",(ulong)(uint)(iVar5 - iVar3));
            local_38 = local_38 + 1;
            printf(" %d",uVar26);
            printf(" %d",uVar19);
            printf(" %d",(ulong)uVar25);
            printf(" %d");
            putchar(10);
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 == 1);
        uVar25 = uVar25 + 1;
      } while (uVar25 != 3);
      uVar25 = (uint)uVar19 + 1;
      uVar19 = (ulong)uVar25;
    } while (uVar25 != 5);
    uVar26 = (ulong)(iVar4 + 1);
  } while (iVar4 == 0);
  function_tests = function_tests + 1;
  iVar2 = 0;
  local_68 = 0;
  do {
    uVar26 = 0;
    do {
      uVar25 = 0;
      do {
        uVar24 = 0;
        do {
          iVar3 = 0;
          do {
            iVar4 = xmlMemBlocks();
            if ((int)local_68 == 0) {
              lVar12 = xmlHashCreate(10);
            }
            else {
              lVar12 = 0;
            }
            if ((uint)uVar26 < 4) {
              uVar21 = (&DAT_00162d68)[uVar26];
            }
            else {
              uVar21 = 0;
            }
            if (uVar25 < 4) {
              uVar15 = (&DAT_00162d68)[uVar25];
            }
            else {
              uVar15 = 0;
            }
            piVar14 = &call_tests;
            if (uVar24 != 0) {
              if (uVar24 == 1) {
                piVar14 = (int *)0xffffffffffffffff;
              }
              else {
                piVar14 = (int *)0x0;
              }
            }
            pcVar16 = (code *)0x0;
            if (iVar3 == 0) {
              pcVar16 = test_xmlHashDeallocator;
            }
            xmlHashUpdateEntry2(lVar12,uVar21,uVar15,piVar14,pcVar16);
            call_tests = call_tests + 1;
            if (lVar12 != 0) {
              xmlHashFree(lVar12);
            }
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar4 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashUpdateEntry2",(ulong)(uint)(iVar5 - iVar4));
              iVar2 = iVar2 + 1;
              printf(" %d",local_68);
              printf(" %d",uVar26);
              printf(" %d",(ulong)uVar25);
              printf(" %d",(ulong)uVar24);
              printf(" %d");
              putchar(10);
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 == 1);
          uVar24 = uVar24 + 1;
        } while (uVar24 != 3);
        uVar25 = uVar25 + 1;
      } while (uVar25 != 5);
      uVar25 = (uint)uVar26 + 1;
      uVar26 = (ulong)uVar25;
    } while (uVar25 != 5);
    bVar30 = (int)local_68 == 0;
    local_68 = (ulong)((int)local_68 + 1);
  } while (bVar30);
  function_tests = function_tests + 1;
  iVar3 = 0;
  local_58 = 0;
  do {
    uVar25 = 0;
    do {
      uVar24 = 0;
      do {
        uVar18 = 0;
        do {
          uVar26 = 0;
          do {
            iVar4 = 0;
            do {
              iVar5 = xmlMemBlocks();
              if ((int)local_58 == 0) {
                lVar12 = xmlHashCreate(10);
              }
              else {
                lVar12 = 0;
              }
              if (uVar25 < 4) {
                uVar21 = (&DAT_00162d68)[uVar25];
              }
              else {
                uVar21 = 0;
              }
              if (uVar24 < 4) {
                uVar15 = (&DAT_00162d68)[uVar24];
              }
              else {
                uVar15 = 0;
              }
              if (uVar18 < 4) {
                uVar13 = (&DAT_00162d68)[uVar18];
              }
              else {
                uVar13 = 0;
              }
              piVar14 = &call_tests;
              iVar8 = (int)uVar26;
              if (iVar8 != 0) {
                if (iVar8 == 1) {
                  piVar14 = (int *)0xffffffffffffffff;
                }
                else {
                  piVar14 = (int *)0x0;
                }
              }
              pcVar16 = (code *)0x0;
              if (iVar4 == 0) {
                pcVar16 = test_xmlHashDeallocator;
              }
              xmlHashUpdateEntry3(lVar12,uVar21,uVar15,uVar13,piVar14,pcVar16);
              call_tests = call_tests + 1;
              if (lVar12 != 0) {
                xmlHashFree(lVar12);
              }
              xmlResetLastError();
              iVar9 = xmlMemBlocks();
              if (iVar5 != iVar9) {
                iVar9 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlHashUpdateEntry3",(ulong)(uint)(iVar9 - iVar5)
                      );
                iVar3 = iVar3 + 1;
                printf(" %d",local_58);
                printf(" %d",(ulong)uVar25);
                printf(" %d",(ulong)uVar24);
                printf(" %d",(ulong)uVar18);
                printf(" %d",uVar26);
                printf(" %d");
                putchar(10);
              }
              iVar4 = iVar4 + 1;
            } while (iVar4 == 1);
            uVar26 = (ulong)(iVar8 + 1U);
          } while (iVar8 + 1U != 3);
          uVar18 = uVar18 + 1;
        } while (uVar18 != 5);
        uVar24 = uVar24 + 1;
      } while (uVar24 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    bVar30 = (int)local_58 == 0;
    local_58 = (ulong)((int)local_58 + 1);
  } while (bVar30);
  function_tests = function_tests + 1;
  uVar25 = iVar1 + iVar6 + iVar7 + iVar17 + local_3c + local_38 + iVar2 + iVar3;
  if (uVar25 != 0) {
    printf("Module hash: %d errors\n",(ulong)uVar25);
  }
  return uVar25;
}

Assistant:

static int
test_hash(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing hash : 17 of 25 functions ...\n");
    test_ret += test_xmlHashAddEntry();
    test_ret += test_xmlHashAddEntry2();
    test_ret += test_xmlHashAddEntry3();
    test_ret += test_xmlHashCopy();
    test_ret += test_xmlHashCreate();
    test_ret += test_xmlHashCreateDict();
    test_ret += test_xmlHashDefaultDeallocator();
    test_ret += test_xmlHashLookup();
    test_ret += test_xmlHashLookup2();
    test_ret += test_xmlHashLookup3();
    test_ret += test_xmlHashQLookup();
    test_ret += test_xmlHashQLookup2();
    test_ret += test_xmlHashQLookup3();
    test_ret += test_xmlHashRemoveEntry();
    test_ret += test_xmlHashRemoveEntry2();
    test_ret += test_xmlHashRemoveEntry3();
    test_ret += test_xmlHashScan();
    test_ret += test_xmlHashScan3();
    test_ret += test_xmlHashScanFull();
    test_ret += test_xmlHashScanFull3();
    test_ret += test_xmlHashSize();
    test_ret += test_xmlHashUpdateEntry();
    test_ret += test_xmlHashUpdateEntry2();
    test_ret += test_xmlHashUpdateEntry3();

    if (test_ret != 0)
	printf("Module hash: %d errors\n", test_ret);
    return(test_ret);
}